

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter_p.h
# Opt level: O1

void __thiscall QCompletionEngine::~QCompletionEngine(QCompletionEngine *this)

{
  Data *pDVar1;
  
  this->_vptr_QCompletionEngine = (_func_int **)&PTR__QCompletionEngine_008236f8;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->cache).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->curParts).d);
  pDVar1 = (this->historyMatch).indices.vector.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->historyMatch).indices.vector.d.d)->super_QArrayData,4,0x10);
    }
  }
  pDVar1 = (this->curMatch).indices.vector.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->curMatch).indices.vector.d.d)->super_QArrayData,4,0x10);
      return;
    }
  }
  return;
}

Assistant:

virtual ~QCompletionEngine() { }